

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

EVdfg_stone INT_EVdfg_create_stone(EVdfg dfg,char *action)

{
  uint uVar1;
  EVdfg_config_action act_00;
  ulong uVar2;
  EVdfg_stone p_Var3;
  char *pcVar4;
  EVdfg_stone *pp_Var5;
  EVdfg_config_action act;
  
  p_Var3 = (EVdfg_stone)INT_CMmalloc(0x10);
  p_Var3->dfg = dfg;
  uVar1 = dfg->stone_count;
  dfg->stone_count = (int)((long)(int)uVar1 + 1);
  p_Var3->stone_id = uVar1 | 0x80000000;
  if (action == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar4 = strdup(action);
  }
  pp_Var5 = (EVdfg_stone *)INT_CMrealloc(dfg->stones,((long)(int)uVar1 + 1) * 8);
  dfg->stones = pp_Var5;
  pp_Var5[(long)dfg->stone_count + -1] = p_Var3;
  uVar2 = CONCAT44(uVar1,1) | 0x8000000000000000;
  act_00._8_8_ = act._8_8_;
  act_00.type = (int)uVar2;
  act_00.stone_id = (int)(uVar2 >> 0x20);
  act_00.u.bridge.action = pcVar4;
  act_00.u._8_8_ = act.u._8_8_;
  EVdfg_perform_act_on_state(dfg->working_state,act_00,1);
  return p_Var3;
}

Assistant:

EVdfg_stone
INT_EVdfg_create_stone(EVdfg dfg, char *action)
{
    EVdfg_stone stone = malloc(sizeof(struct _EVdfg_stone));
    EVdfg_config_action act;
    stone->dfg = dfg;
    stone->stone_id = 0x80000000 | dfg->stone_count++;
    act.type = ACT_create;
    act.stone_id = stone->stone_id;
    act.u.create.action = action ? strdup(action) : NULL;
    dfg->stones = realloc(dfg->stones, sizeof(dfg->stones[0]) * dfg->stone_count);
    dfg->stones[dfg->stone_count-1] = stone;
    EVdfg_perform_act_on_state(dfg->working_state, act, 1 /* add to queue */);
    return stone;
}